

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_arithm<unsigned_short>
               (uint length,unsigned_short value1,unsigned_short value2,bool allowTrash)

{
  bool bVar1;
  unsigned_short *puVar2;
  element_type *pDst;
  element_type *pDst_00;
  element_type *pDst_01;
  undefined8 *puVar3;
  uint local_a0;
  uint local_9c;
  uint i_10;
  uint i_9;
  uint i_8;
  uint i_7;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  unsigned_short r;
  uint i;
  unsigned_short *result;
  unsigned_short *v2;
  unsigned_short *v1;
  shared_ptr<unsigned_short> presult;
  undefined1 local_38 [8];
  shared_ptr<unsigned_short> pv2;
  shared_ptr<unsigned_short> pv1;
  bool allowTrash_local;
  unsigned_short value2_local;
  unsigned_short value1_local;
  uint length_local;
  
  puVar2 = nosimd::common::malloc<unsigned_short>(length);
  std::shared_ptr<unsigned_short>::shared_ptr<unsigned_short,void(*)(unsigned_short*),void>
            ((shared_ptr<unsigned_short> *)
             &pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar2,
             nosimd::common::free<unsigned_short>);
  puVar2 = nosimd::common::malloc<unsigned_short>(length);
  std::shared_ptr<unsigned_short>::shared_ptr<unsigned_short,void(*)(unsigned_short*),void>
            ((shared_ptr<unsigned_short> *)local_38,puVar2,nosimd::common::free<unsigned_short>);
  puVar2 = nosimd::common::malloc<unsigned_short>(length + 1);
  std::shared_ptr<unsigned_short>::shared_ptr<unsigned_short,void(*)(unsigned_short*),void>
            ((shared_ptr<unsigned_short> *)&v1,puVar2,nosimd::common::free<unsigned_short>);
  pDst = std::__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2> *)
                    &pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  pDst_00 = std::__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  pDst_01 = std::__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2> *)&v1);
  pDst_01[length] = 0x7f;
  nosimd::common::set<unsigned_short>(value1,pDst,length);
  nosimd::common::set<unsigned_short>(value2,pDst_00,length);
  for (i_1 = 0; i_1 < length; i_1 = i_1 + 1) {
    bVar1 = anon_unknown.dwarf_c3e8::equal<unsigned_short>(pDst[i_1],value1);
    if ((!bVar1) ||
       (bVar1 = anon_unknown.dwarf_c3e8::equal<unsigned_short>(pDst_00[i_1],value2), !bVar1)) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar3 + 1) = 0x1a;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::add<unsigned_short>(pDst,pDst_00,pDst_01,length);
  for (i_3 = 0; i_3 < length; i_3 = i_3 + 1) {
    bVar1 = anon_unknown.dwarf_c3e8::equal<unsigned_short>(pDst_01[i_3],value1 + value2);
    if (!bVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar3 + 1) = 0x22;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::sub<unsigned_short>(pDst,pDst_00,pDst_01,length);
  for (i_4 = 0; i_4 < length; i_4 = i_4 + 1) {
    bVar1 = anon_unknown.dwarf_c3e8::equal<unsigned_short>(pDst_01[i_4],value1 - value2);
    if (!bVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar3 + 1) = 0x2a;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::mul<unsigned_short>(pDst,pDst_00,pDst_01,length);
  for (i_5 = 0; i_5 < length; i_5 = i_5 + 1) {
    bVar1 = anon_unknown.dwarf_c3e8::equal<unsigned_short>(pDst_01[i_5],value1 * value2);
    if (!bVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar3 + 1) = 0x32;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::div<unsigned_short>(pDst,pDst_00,pDst_01,length);
  for (i_6 = 0; i_6 < length; i_6 = i_6 + 1) {
    bVar1 = anon_unknown.dwarf_c3e8::equal<unsigned_short>(pDst_01[i_6],value1 / value2);
    if (!bVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar3 + 1) = 0x3a;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::addC<unsigned_short>(pDst,value2,pDst_01,length);
  for (i_7 = 0; i_7 < length; i_7 = i_7 + 1) {
    bVar1 = anon_unknown.dwarf_c3e8::equal<unsigned_short>(pDst_01[i_7],value1 + value2);
    if (!bVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar3 + 1) = 0x43;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::subC<unsigned_short>(pDst,value2,pDst_01,length);
  for (i_8 = 0; i_8 < length; i_8 = i_8 + 1) {
    if (pDst_01[i_8] != (element_type)(value1 - value2)) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar3 + 1) = 0x4b;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::subCRev<unsigned_short>(pDst,value2,pDst_01,length);
  for (i_9 = 0; i_9 < length; i_9 = i_9 + 1) {
    bVar1 = anon_unknown.dwarf_c3e8::equal<unsigned_short>(pDst_01[i_9],value2 - value1);
    if (!bVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar3 + 1) = 0x53;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::mulC<unsigned_short>(pDst,value2,pDst_01,length);
  for (i_10 = 0; i_10 < length; i_10 = i_10 + 1) {
    if (pDst_01[i_10] != (element_type)(value1 * value2)) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar3 + 1) = 0x5b;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divC<unsigned_short>(pDst,value2,pDst_01,length);
  for (local_9c = 0; local_9c < length; local_9c = local_9c + 1) {
    bVar1 = anon_unknown.dwarf_c3e8::equal<unsigned_short>(pDst_01[local_9c],value1 / value2);
    if (!bVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar3 + 1) = 99;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::divCRev<unsigned_short>(pDst,value2,pDst_01,length);
  for (local_a0 = 0; local_a0 < length; local_a0 = local_a0 + 1) {
    bVar1 = anon_unknown.dwarf_c3e8::equal<unsigned_short>(pDst_01[local_a0],value2 / value1);
    if (!bVar1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
      *(undefined4 *)(puVar3 + 1) = 0x6b;
      *(uint *)((long)puVar3 + 0xc) = length;
      __cxa_throw(puVar3,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) && (pDst_01[length] != 0x7f)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar3 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned short]";
    *(undefined4 *)(puVar3 + 1) = 0x70;
    *(uint *)((long)puVar3 + 0xc) = length;
    __cxa_throw(puVar3,&Exception::typeinfo,0);
  }
  std::shared_ptr<unsigned_short>::~shared_ptr((shared_ptr<unsigned_short> *)&v1);
  std::shared_ptr<unsigned_short>::~shared_ptr((shared_ptr<unsigned_short> *)local_38);
  std::shared_ptr<unsigned_short>::~shared_ptr
            ((shared_ptr<unsigned_short> *)
             &pv2.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}